

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawPolyLines(Vector2 center,int sides,float radius,float rotation,Color color)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  
  iVar1 = 3;
  if (3 < sides) {
    iVar1 = sides;
  }
  fVar4 = (float)iVar1;
  local_58 = rotation * 0.017453292;
  rlBegin(1);
  uStack_44 = center.y;
  do {
    rlColor4ub(color.r,color.g,color.b,color.a);
    fVar2 = cosf(local_58);
    local_48 = center.x;
    fVar3 = sinf(local_58);
    rlVertex2f(fVar2 * radius + local_48,fVar3 * radius + uStack_44);
    local_58 = local_58 + (360.0 / fVar4) * 0.017453292;
    fVar2 = cosf(local_58);
    fVar3 = sinf(local_58);
    rlVertex2f(fVar2 * radius + local_48,fVar3 * radius + uStack_44);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  rlEnd();
  return;
}

Assistant:

void DrawPolyLines(Vector2 center, int sides, float radius, float rotation, Color color)
{
    if (sides < 3) sides = 3;
    float centralAngle = rotation*DEG2RAD;
    float angleStep = 360.0f/(float)sides*DEG2RAD;

    rlBegin(RL_LINES);
        for (int i = 0; i < sides; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x + cosf(centralAngle)*radius, center.y + sinf(centralAngle)*radius);
            rlVertex2f(center.x + cosf(centralAngle + angleStep)*radius, center.y + sinf(centralAngle + angleStep)*radius);

            centralAngle += angleStep;
        }
    rlEnd();
}